

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double pythag(double a,double b)

{
  double dVar1;
  double dVar2;
  undefined8 local_48;
  double val;
  double absb;
  double absa;
  double b_local;
  double a_local;
  
  dVar1 = ABS(a);
  local_48 = ABS(b);
  if (dVar1 <= local_48) {
    if ((local_48 != 0.0) || (NAN(local_48))) {
      dVar1 = sqrt((dVar1 / local_48) * (dVar1 / local_48) + 1.0);
      local_48 = local_48 * dVar1;
    }
    else {
      local_48 = 0.0;
    }
    a_local = local_48;
  }
  else {
    dVar2 = sqrt((local_48 / dVar1) * (local_48 / dVar1) + 1.0);
    a_local = dVar1 * dVar2;
  }
  return a_local;
}

Assistant:

static double pythag(double a, double b) {
	double absa, absb,val;
	absa = (double) fabs(a);
	absb = (double) fabs(b);

	if (absa > absb) {
		val = (double) absa*sqrt(1.0 + (absb / absa)*(absb / absa));
		return val;
	}
	else {
		val = (double) (absb == 0.0 ? 0.0 : absb*sqrt(1.0 + (absa / absb)*(absa / absb)));
		return val;
	}
}